

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrj_.c
# Opt level: O1

void hybrj_(minpack_funcder_nn fcnder_nn,int *n,double *x,double *fvec,double *fjac,int *ldfjac,
           double *xtol,int *maxfev,double *diag,int *mode,double *factor,int *nprint,int *info,
           int *nfev,int *njev,double *r__,int *lr,double *qtf,double *wa1,double *wa2,double *wa3,
           double *wa4)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  uint uVar10;
  double *pdVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int local_114;
  double *local_110;
  double delta;
  double *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  double *local_e8;
  minpack_funcder_nn local_e0;
  ulong local_d8;
  int local_d0;
  int local_cc;
  int sing;
  int c__1;
  double local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double *local_a0;
  double local_98;
  int c_false;
  long local_88;
  ulong local_80;
  double local_78;
  double local_68;
  long local_60;
  double *local_58;
  int iwa [1];
  
  c_false = 0;
  c__1 = 1;
  local_80 = (ulong)*ldfjac;
  local_110 = fjac;
  local_100 = fvec;
  local_e8 = x;
  local_e0 = fcnder_nn;
  dVar13 = dpmpar_(&c__1);
  *info = 0;
  local_114 = 0;
  *nfev = 0;
  *njev = 0;
  uVar1 = *n;
  if ((((0 < (int)uVar1) && ((int)uVar1 <= *ldfjac)) && (0.0 < *xtol || *xtol == 0.0)) &&
     (((0 < *maxfev && (0.0 < *factor)) && ((int)((uVar1 + 1) * uVar1 >> 1) <= *lr)))) {
    if (*mode == 2) {
      uVar3 = 0;
      do {
        if (diag[uVar3] <= 0.0) goto LAB_001024c8;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    local_114 = 1;
    local_98 = dVar13;
    (*local_e0)(n,local_e8,local_100,local_110,ldfjac,&local_114);
    pdVar8 = local_100;
    *nfev = 1;
    if (-1 < local_114) {
      local_c0 = enorm_(n,local_100);
      local_114 = 2;
      (*local_e0)(n,local_e8,pdVar8,local_110,ldfjac,&local_114);
      *njev = *njev + 1;
      if (-1 < local_114) {
        local_58 = local_110 + ~local_80;
        local_88 = local_80 * 8;
        local_a0 = local_110 + local_80 + ~local_80 + 1;
        local_60 = local_80 * 8 + 8;
        local_d8 = 1;
        local_b8 = 0.0;
        local_f4 = 0;
        local_f0 = 0;
        local_ec = 0;
        local_d0 = 0;
        do {
          qrfac_(n,n,local_110,ldfjac,&c_false,iwa,&c__1,wa1,wa2,wa3);
          uVar3 = local_80;
          if ((int)local_d8 == 1) {
            if ((*mode != 2) && (uVar1 = *n, 0 < (int)uVar1)) {
              uVar4 = 0;
              do {
                diag[uVar4] = wa2[uVar4];
                if ((wa2[uVar4] == 0.0) && (!NAN(wa2[uVar4]))) {
                  diag[uVar4] = 1.0;
                }
                uVar4 = uVar4 + 1;
              } while (uVar1 != uVar4);
            }
            uVar1 = *n;
            if (0 < (int)uVar1) {
              uVar4 = 0;
              do {
                wa3[uVar4] = diag[uVar4] * local_e8[uVar4];
                uVar4 = uVar4 + 1;
              } while (uVar1 != uVar4);
            }
            local_b8 = enorm_(n,wa3);
            delta = local_b8 * *factor;
            if ((delta == 0.0) && (!NAN(delta))) {
              delta = *factor;
            }
          }
          uVar1 = *n;
          uVar4 = (ulong)uVar1;
          if (0 < (int)uVar1) {
            uVar5 = 0;
            do {
              qtf[uVar5] = local_100[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          if (0 < (int)uVar1) {
            lVar7 = uVar4 + 1;
            lVar6 = 1;
            pdVar8 = qtf;
            pdVar11 = local_a0;
            do {
              dVar13 = local_58[lVar6 + (int)lVar6 * (int)uVar3];
              if ((dVar13 != 0.0) || (NAN(dVar13))) {
                dVar14 = 0.0;
                uVar5 = 0;
                do {
                  dVar14 = dVar14 + pdVar11[uVar5] * pdVar8[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar4 != uVar5);
                uVar5 = 0;
                do {
                  pdVar8[uVar5] = pdVar11[uVar5] * (-dVar14 / dVar13) + pdVar8[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar4 != uVar5);
              }
              lVar6 = lVar6 + 1;
              pdVar11 = (double *)((long)pdVar11 + local_60);
              pdVar8 = pdVar8 + 1;
              uVar4 = uVar4 - 1;
            } while (lVar6 != lVar7);
          }
          sing = 0;
          if (0 < (int)uVar1) {
            uVar3 = 1;
            lVar7 = 0;
            pdVar8 = local_a0;
            do {
              uVar10 = (uint)uVar3;
              if (1 < uVar3) {
                lVar6 = 0;
                uVar4 = uVar3 & 0xffffffff;
                uVar12 = uVar1;
                do {
                  uVar12 = uVar12 - 1;
                  r__[(long)(int)uVar4 + -1] = pdVar8[lVar6];
                  uVar10 = (int)uVar4 + uVar12;
                  uVar4 = (ulong)uVar10;
                  lVar6 = lVar6 + 1;
                } while (lVar7 != lVar6);
              }
              r__[(long)(int)uVar10 + -1] = wa1[uVar3 - 1];
              if ((wa1[uVar3 - 1] == 0.0) && (!NAN(wa1[uVar3 - 1]))) {
                sing = 1;
              }
              uVar3 = uVar3 + 1;
              pdVar8 = (double *)((long)pdVar8 + local_88);
              lVar7 = lVar7 + 1;
            } while (uVar3 != uVar1 + 1);
          }
          qform_(n,n,local_110,ldfjac,wa1);
          if ((*mode != 2) && (uVar1 = *n, 0 < (int)uVar1)) {
            uVar3 = 0;
            do {
              uVar4 = -(ulong)(wa2[uVar3] <= diag[uVar3]);
              diag[uVar3] = (double)(~uVar4 & (ulong)wa2[uVar3] | (ulong)diag[uVar3] & uVar4);
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          local_cc = 1;
          while( true ) {
            if (0 < *nprint) {
              local_114 = 0;
              if (((int)local_d8 + -1) % *nprint == 0) {
                (*local_e0)(n,local_e8,local_100,local_110,ldfjac,&local_114);
              }
              if (local_114 < 0) goto LAB_001024c8;
            }
            dogleg_(n,r__,lr,diag,qtf,&delta,wa1,wa2,wa3);
            uVar1 = *n;
            if (0 < (int)uVar1) {
              uVar3 = 0;
              do {
                dVar13 = wa1[uVar3];
                wa1[uVar3] = -dVar13;
                wa2[uVar3] = local_e8[uVar3] - dVar13;
                wa3[uVar3] = diag[uVar3] * wa1[uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar1 != uVar3);
            }
            local_78 = enorm_(n,wa3);
            if ((int)local_d8 == 1) {
              delta = (double)(~-(ulong)(delta <= local_78) & (ulong)local_78 |
                              (ulong)delta & -(ulong)(delta <= local_78));
            }
            local_114 = 1;
            (*local_e0)(n,wa2,wa4,local_110,ldfjac,&local_114);
            *nfev = *nfev + 1;
            if (local_114 < 0) goto LAB_001024c8;
            local_68 = enorm_(n,wa4);
            uVar3 = (ulong)(uint)*n;
            if (0 < *n) {
              lVar7 = uVar3 + 1;
              lVar6 = 1;
              lVar9 = 1;
              pdVar8 = wa1;
              do {
                dVar13 = 0.0;
                uVar4 = 0;
                do {
                  dVar13 = dVar13 + r__[(long)(int)lVar9 + (uVar4 - 1)] * pdVar8[uVar4];
                  uVar4 = uVar4 + 1;
                } while (uVar3 != uVar4);
                wa3[lVar6 + -1] = dVar13 + qtf[lVar6 + -1];
                lVar6 = lVar6 + 1;
                pdVar8 = pdVar8 + 1;
                uVar3 = uVar3 - 1;
                lVar9 = (long)(int)lVar9 + uVar4;
              } while (lVar6 != lVar7);
            }
            dVar13 = (double)(~-(ulong)(local_68 < local_c0) & 0xbff0000000000000 |
                             (ulong)(1.0 - (local_68 / local_c0) * (local_68 / local_c0)) &
                             -(ulong)(local_68 < local_c0));
            dVar14 = enorm_(n,wa3);
            dVar14 = (double)(-(ulong)(dVar14 < local_c0) &
                             (ulong)(1.0 - (dVar14 / local_c0) * (dVar14 / local_c0)));
            dVar14 = (double)(-(ulong)(0.0 < dVar14) & (ulong)(dVar13 / dVar14));
            if (0.1 <= dVar14) {
              dVar15 = local_78 + local_78;
              if (0 < local_d0 || 0.5 <= dVar14) {
                delta = (double)(~-(ulong)(dVar15 <= delta) & (ulong)dVar15 |
                                (ulong)delta & -(ulong)(dVar15 <= delta));
              }
              local_d0 = local_d0 + 1;
              local_f4 = 0;
              if (ABS(dVar14 + -1.0) <= 0.1) {
                delta = dVar15;
              }
            }
            else {
              local_f4 = local_f4 + 1;
              local_d0 = 0;
              delta = delta * 0.5;
            }
            dVar15 = local_b8;
            if (0.0001 <= dVar14) {
              uStack_b0 = 0;
              uVar1 = *n;
              if (0 < (int)uVar1) {
                uVar3 = 0;
                do {
                  dVar15 = wa2[uVar3];
                  local_e8[uVar3] = dVar15;
                  wa2[uVar3] = dVar15 * diag[uVar3];
                  local_100[uVar3] = wa4[uVar3];
                  uVar3 = uVar3 + 1;
                } while (uVar1 != uVar3);
              }
              local_b8 = dVar14;
              dVar15 = enorm_(n,wa2);
              local_d8 = (ulong)((int)local_d8 + 1);
              local_c0 = local_68;
              dVar14 = local_b8;
            }
            local_ec = local_ec + 1;
            if (0.001 <= dVar13) {
              local_ec = 0;
            }
            local_f0 = local_f0 + local_cc;
            if (0.1 <= dVar13) {
              local_f0 = 0;
            }
            if ((delta <= *xtol * dVar15) || ((local_c0 == 0.0 && (!NAN(local_c0))))) {
              *info = 1;
            }
            local_b8 = dVar15;
            if (*info != 0) goto LAB_001024c8;
            uVar3 = -(ulong)(local_78 <= delta * 0.1);
            dVar13 = (double)(~uVar3 & (ulong)local_78 | (ulong)(delta * 0.1) & uVar3) * 0.1;
            if ((((local_ec == 10) || (dVar13 <= local_98 * dVar15)) || (local_f0 == 5)) ||
               (*maxfev <= *nfev)) {
              iVar2 = 3 - (uint)(local_98 * dVar15 < dVar13);
              if (local_f0 == 5) {
                iVar2 = 4;
              }
              if (local_ec == 10) {
                iVar2 = 5;
              }
              *info = iVar2;
            }
            if (*info != 0) goto LAB_001024c8;
            if (local_f4 == 2) break;
            uVar1 = *n;
            if (0 < (int)uVar1) {
              lVar7 = 1;
              pdVar8 = local_a0;
              do {
                dVar13 = 0.0;
                uVar3 = 0;
                do {
                  dVar13 = dVar13 + pdVar8[uVar3] * wa4[uVar3];
                  uVar3 = uVar3 + 1;
                } while (uVar1 != uVar3);
                wa2[lVar7 + -1] = (dVar13 - wa3[lVar7 + -1]) / local_78;
                wa1[lVar7 + -1] =
                     ((wa1[lVar7 + -1] * diag[lVar7 + -1]) / local_78) * diag[lVar7 + -1];
                if (0.0001 <= dVar14) {
                  qtf[lVar7 + -1] = dVar13;
                }
                lVar7 = lVar7 + 1;
                pdVar8 = (double *)((long)pdVar8 + local_88);
              } while (lVar7 != (ulong)uVar1 + 1);
            }
            r1updt_(n,n,r__,lr,wa1,wa2,wa3,&sing);
            r1mpyq_(n,n,local_110,ldfjac,wa2,wa3);
            r1mpyq_(&c__1,n,qtf,&c__1,wa2,wa3);
            local_cc = 0;
          }
          local_114 = 2;
          (*local_e0)(n,local_e8,local_100,local_110,ldfjac,&local_114);
          *njev = *njev + 1;
          local_f4 = 2;
        } while (-1 < local_114);
      }
    }
  }
LAB_001024c8:
  if (local_114 < 0) {
    *info = local_114;
  }
  local_114 = 0;
  if (0 < *nprint) {
    (*local_e0)(n,local_e8,local_100,local_110,ldfjac,&local_114);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(hybrj)(__minpack_decl_fcnder_nn__  const int *n, real *x, real *
	fvec, real *fjac, const int *ldfjac, const real *xtol, const int *
	maxfev, real *diag, const int *mode, const real *factor, const int *
	nprint, int *info, int *nfev, int *njev, real *r__, 
	const int *lr, real *qtf, real *wa1, real *wa2, 
	real *wa3, real *wa4)
{
    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p001 .001
#define p0001 1e-4
    const int c_false = FALSE_;
    const int c__1 = 1;

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;
    real d__1, d__2;

    /* Local variables */
    int i__, j, l, jm1, iwa[1];
    real sum;
    int sing;
    int iter;
    real temp;
    int iflag;
    real delta;
    int jeval;
    int ncsuc;
    real ratio;
    real fnorm;
    real pnorm, xnorm = 0, fnorm1;
    int nslow1, nslow2;
    int ncfail;
    real actred, epsmch, prered;

/*     ********** */

/*     subroutine hybrj */

/*     the purpose of hybrj is to find a zero of a system of */
/*     n nonlinear functions in n variables by a modification */
/*     of the powell hybrid method. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine hybrj(fcn,n,x,fvec,fjac,ldfjac,xtol,maxfev,diag, */
/*                        mode,factor,nprint,info,nfev,njev,r,lr,qtf, */
/*                        wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(n,x,fvec,fjac,ldfjac,iflag) */
/*         integer n,ldfjac,iflag */
/*         double precision x(n),fvec(n),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         --------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of hybrj. */
/*         in this case set iflag to a negative integer. */

/*       n is a positive integer input variable set to the number */
/*         of functions and variables. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length n which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output n by n array which contains the */
/*         orthogonal matrix q produced by the qr factorization */
/*         of the final approximate jacobian. */

/*       ldfjac is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array fjac. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.). 100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x and fvec available */
/*         for printing. fvec and fjac should not be altered. */
/*         if nprint is not positive, no special calls of fcn */
/*         with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0   improper input parameters. */

/*         info = 1   relative error between two consecutive iterates */
/*                    is at most xtol. */

/*         info = 2   number of calls to fcn with iflag = 1 has */
/*                    reached maxfev. */

/*         info = 3   xtol is too small. no further improvement in */
/*                    the approximate solution x is possible. */

/*         info = 4   iteration is not making good progress, as */
/*                    measured by the improvement from the last */
/*                    five jacobian evaluations. */

/*         info = 5   iteration is not making good progress, as */
/*                    measured by the improvement from the last */
/*                    ten iterations. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       r is an output array of length lr which contains the */
/*         upper triangular matrix produced by the qr factorization */
/*         of the final approximate jacobian, stored rowwise. */

/*       lr is a positive integer input variable not less than */
/*         (n*(n+1))/2. */

/*       qtf is an output array of length n which contains */
/*         the vector (q transpose)*fvec. */

/*       wa1, wa2, wa3, and wa4 are work arrays of length n. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dogleg,dpmpar,enorm, */
/*                            qform,qrfac,r1mpyq,r1updt */

/*       fortran-supplied ... dabs,dmax1,dmin1,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa4;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --diag;
    --fvec;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;
    --r__;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    *info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (*n <= 0 || *ldfjac < *n || *xtol < 0. || *maxfev <= 0 || *factor <= 
	    0. || *lr < *n * (*n + 1) / 2) {
	goto L300;
    }
    if (*mode != 2) {
	goto L20;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (diag[j] <= 0.) {
	    goto L300;
	}
/* L10: */
    }
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = 1;
    fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    *nfev = 1;
    if (iflag < 0) {
	goto L300;
    }
    fnorm = __minpack_func__(enorm)(n, &fvec[1]);

/*     initialize iteration counter and monitors. */

    iter = 1;
    ncsuc = 0;
    ncfail = 0;
    nslow1 = 0;
    nslow2 = 0;

/*     beginning of the outer loop. */

L30:
    jeval = TRUE_;

/*        calculate the jacobian matrix. */

    iflag = 2;
    fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*njev);
    if (iflag < 0) {
	goto L300;
    }

/*        compute the qr factorization of the jacobian. */

    __minpack_func__(qrfac)(n, n, &fjac[fjac_offset], ldfjac, &c_false, iwa, &c__1, &wa1[1], &
	    wa2[1], &wa3[1]);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

    if (iter != 1) {
	goto L70;
    }
    if (*mode == 2) {
	goto L50;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	diag[j] = wa2[j];
	if (wa2[j] == 0.) {
	    diag[j] = 1.;
	}
/* L40: */
    }
L50:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = diag[j] * x[j];
/* L60: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa3[1]);
    delta = *factor * xnorm;
    if (delta == 0.) {
	delta = *factor;
    }
L70:

/*        form (q transpose)*fvec and store in qtf. */

    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	qtf[i__] = fvec[i__];
/* L80: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (fjac[j + j * fjac_dim1] == 0.) {
	    goto L110;
	}
	sum = 0.;
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * qtf[i__];
/* L90: */
	}
	temp = -sum / fjac[j + j * fjac_dim1];
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    qtf[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L100: */
	}
L110:
/* L120: */
	;
    }

/*        copy the triangular factor of the qr factorization into r. */

    sing = FALSE_;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = j;
	jm1 = j - 1;
	if (jm1 < 1) {
	    goto L140;
	}
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    r__[l] = fjac[i__ + j * fjac_dim1];
	    l = l + *n - i__;
/* L130: */
	}
L140:
	r__[l] = wa1[j];
	if (wa1[j] == 0.) {
	    sing = TRUE_;
	}
/* L150: */
    }

/*        accumulate the orthogonal factor in fjac. */

    __minpack_func__(qform)(n, n, &fjac[fjac_offset], ldfjac, &wa1[1]);

/*        rescale if necessary. */

    if (*mode == 2) {
	goto L170;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/* L160: */
    }
L170:

/*        beginning of the inner loop. */

L180:

/*           if requested, call fcn to enable printing of iterates. */

    if (*nprint <= 0) {
	goto L190;
    }
    iflag = 0;
    if ((iter - 1) % *nprint == 0) {
	fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    if (iflag < 0) {
	goto L300;
    }
L190:

/*           determine the direction p. */

    __minpack_func__(dogleg)(n, &r__[1], lr, &diag[1], &qtf[1], &delta, &wa1[1], &wa2[1], &wa3[
	    1]);

/*           store the direction p and x + p. calculate the norm of p. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = -wa1[j];
	wa2[j] = x[j] + wa1[j];
	wa3[j] = diag[j] * wa1[j];
/* L200: */
    }
    pnorm = __minpack_func__(enorm)(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

    iflag = 1;
    fcnder_nn(n, &wa2[1], &wa4[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*nfev);
    if (iflag < 0) {
	goto L300;
    }
    fnorm1 = __minpack_func__(enorm)(n, &wa4[1]);

/*           compute the scaled actual reduction. */

    actred = -1.;
    if (fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = 1 - d__1 * d__1;
    }

/*           compute the scaled predicted reduction. */

    l = 1;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	sum = 0.;
	i__2 = *n;
	for (j = i__; j <= i__2; ++j) {
	    sum += r__[l] * wa1[j];
	    ++l;
/* L210: */
	}
	wa3[i__] = qtf[i__] + sum;
/* L220: */
    }
    temp = __minpack_func__(enorm)(n, &wa3[1]);
    prered = 0.;
    if (temp < fnorm) {
/* Computing 2nd power */
	d__1 = temp / fnorm;
	prered = 1 - d__1 * d__1;
    }

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

    ratio = 0.;
    if (prered > 0.) {
	ratio = actred / prered;
    }

/*           update the step bound. */

    if (ratio >= p1) {
	goto L230;
    }
    ncsuc = 0;
    ++ncfail;
    delta = p5 * delta;
    goto L240;
L230:
    ncfail = 0;
    ++ncsuc;
    if (ratio >= p5 || ncsuc > 1) {
/* Computing MAX */
	d__1 = delta, d__2 = pnorm / p5;
	delta = max(d__1,d__2);
    }
    if (fabs(ratio - 1) <= p1) {
	delta = pnorm / p5;
    }
L240:

/*           test for successful iteration. */

    if (ratio < p0001) {
	goto L260;
    }

/*           successful iteration. update x, fvec, and their norms. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	x[j] = wa2[j];
	wa2[j] = diag[j] * x[j];
	fvec[j] = wa4[j];
/* L250: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa2[1]);
    fnorm = fnorm1;
    ++iter;
L260:

/*           determine the progress of the iteration. */

    ++nslow1;
    if (actred >= p001) {
	nslow1 = 0;
    }
    if (jeval) {
	++nslow2;
    }
    if (actred >= p1) {
	nslow2 = 0;
    }

/*           test for convergence. */

    if (delta <= *xtol * xnorm || fnorm == 0.) {
	*info = 1;
    }
    if (*info != 0) {
	goto L300;
    }

/*           tests for termination and stringent tolerances. */

    if (*nfev >= *maxfev) {
	*info = 2;
    }
/* Computing MAX */
    d__1 = p1 * delta;
    if (p1 * max(d__1,pnorm) <= epsmch * xnorm) {
	*info = 3;
    }
    if (nslow2 == 5) {
	*info = 4;
    }
    if (nslow1 == 10) {
	*info = 5;
    }
    if (*info != 0) {
	goto L300;
    }

/*           criterion for recalculating jacobian. */

    if (ncfail == 2) {
	goto L290;
    }

/*           calculate the rank one modification to the jacobian */
/*           and update qtf if necessary. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sum = 0.;
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * wa4[i__];
/* L270: */
	}
	wa2[j] = (sum - wa3[j]) / pnorm;
	wa1[j] = diag[j] * (diag[j] * wa1[j] / pnorm);
	if (ratio >= p0001) {
	    qtf[j] = sum;
	}
/* L280: */
    }

/*           compute the qr factorization of the updated jacobian. */

    __minpack_func__(r1updt)(n, n, &r__[1], lr, &wa1[1], &wa2[1], &wa3[1], &sing);
    __minpack_func__(r1mpyq)(n, n, &fjac[fjac_offset], ldfjac, &wa2[1], &wa3[1]);
    __minpack_func__(r1mpyq)(&c__1, n, &qtf[1], &c__1, &wa2[1], &wa3[1]);

/*           end of the inner loop. */

    jeval = FALSE_;
    goto L180;
L290:

/*        end of the outer loop. */

    goto L30;
L300:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	*info = iflag;
    }
    iflag = 0;
    if (*nprint > 0) {
	fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    return;

/*     last card of subroutine hybrj. */

}